

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

void Gia_ManCheckIntegrityWithBoxes(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  ulong uVar7;
  Vec_Int_t *__ptr;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  if (p->pManTime != (void *)0x0) {
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
    Gia_ManCreateRefs(p);
    iVar2 = p->vCos->nSize;
    iVar3 = p->nRegs;
    iVar6 = Gia_ManRegBoxNum(p);
    iVar4 = p->vCos->nSize;
    iVar10 = iVar4 - p->nRegs;
    uVar13 = iVar2 - (iVar6 + iVar3);
    uVar9 = 0;
    uVar12 = 0;
    if ((int)uVar13 < iVar10) {
      uVar7 = (ulong)uVar13;
      uVar12 = 0;
      do {
        if (((int)uVar13 < 0) || (iVar4 <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = p->vCos->pArray[uVar7];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0022ea4a;
        pGVar5 = p->pObjs;
        pGVar1 = pGVar5 + iVar2;
        uVar11 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
        if ((~*(uint *)(pGVar1 + -uVar11) & 0x9fffffff) != 0) {
          __assert_fail("Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                        ,0x1ae,"void Gia_ManCheckIntegrityWithBoxes(Gia_Man_t *)");
        }
        pGVar1 = pGVar1 + -uVar11;
        if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar12 = uVar12 + (1 < p->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar5) >> 2) *
                                        -0x55555555]);
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < iVar10);
    }
    __ptr = Gia_ManComputeCarryOuts(p);
    if (0 < (long)__ptr->nSize) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        iVar2 = __ptr->pArray[lVar8];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_0022ea4a:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar9 = uVar9 + (1 < p->pRefs[iVar2]);
        lVar8 = lVar8 + 1;
      } while (__ptr->nSize != lVar8);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    if (uVar12 != 0 || uVar9 != 0) {
      printf("Warning: AIG with boxes has internal fanout in %d complex flops and %d carries.\n",
             (ulong)uVar12,(ulong)uVar9);
    }
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
  }
  return;
}

Assistant:

void Gia_ManCheckIntegrityWithBoxes( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vCarryOuts;
    int i, nCountReg = 0, nCountCarry = 0;
    if ( p->pManTime == NULL )
        return;
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    for ( i = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p); i < Gia_ManPoNum(p); i++ )
    {
        pObj = Gia_ObjFanin0( Gia_ManPo(p, i) );
        assert( Gia_ObjIsCi(pObj) );
        if ( Gia_ObjRefNum(p, pObj) > 1 )
            nCountReg++;
    }
    vCarryOuts = Gia_ManComputeCarryOuts( p );
    Gia_ManForEachObjVec( vCarryOuts, p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) > 1 )
            nCountCarry++;
    Vec_IntFree( vCarryOuts );
    if ( nCountReg || nCountCarry )
        printf( "Warning: AIG with boxes has internal fanout in %d complex flops and %d carries.\n", nCountReg, nCountCarry );
    ABC_FREE( p->pRefs );
}